

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void pnga_access_ghost_ptr(Integer g_a,Integer *dims,void *ptr,Integer *ld)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer proc;
  Integer IVar6;
  long lVar7;
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  C_Integer CVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer hi [7];
  Integer lo [7];
  
  lVar1 = g_a + 1000;
  uVar2 = GA[lVar1].ndim;
  uVar17 = 0;
  proc = pnga_nodeid();
  pnga_distribution(g_a,proc,lo,hi);
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; pgVar5 = GA, uVar2 != uVar17; uVar17 = uVar17 + 1) {
    dims[uVar17] = 0;
  }
  uVar9 = GA[lVar1].ndim;
  lVar12 = (long)(short)uVar9;
  lVar13 = lVar12 + -1;
  iVar14 = GA[lVar1].distr_type;
  if (iVar14 - 1U < 3) {
    lVar10 = (long)(int)proc % GA[lVar1].num_blocks[0];
    _index[0] = (int)lVar10;
    IVar6 = proc;
    lVar7 = 0;
    while (lVar7 + 1 < lVar12) {
      IVar6 = (long)((int)IVar6 - (int)lVar10) / GA[g_a + 1000].num_blocks[lVar7];
      lVar10 = (long)(int)IVar6 % GA[g_a + 1000].num_blocks[lVar7 + 1];
      _index[lVar7 + 1] = (int)lVar10;
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    uVar8 = 0;
    if (0 < (short)uVar9) {
      uVar8 = uVar9;
    }
    for (; (ulong)uVar8 * 4 != lVar7; lVar7 = lVar7 + 4) {
      iVar14 = *(int *)((long)_index + lVar7);
      lVar10 = *(long *)((long)GA[g_a + 1000].block_dims + lVar7 * 2);
      *(long *)((long)_lo + lVar7 * 2) = lVar10 * iVar14 + 1;
      lVar10 = ((long)iVar14 + 1) * lVar10;
      lVar15 = *(long *)((long)GA[g_a + 1000].dims + lVar7 * 2);
      if (lVar15 <= lVar10) {
        lVar10 = lVar15;
      }
      *(long *)((long)_hi + lVar7 * 2) = lVar10;
    }
  }
  else if (iVar14 == 4) {
    lVar10 = (long)(int)proc % GA[lVar1].num_blocks[0];
    _index[0] = (int)lVar10;
    IVar6 = proc;
    lVar7 = 0;
    while (lVar7 + 1 < lVar12) {
      IVar6 = (long)((int)IVar6 - (int)lVar10) / GA[g_a + 1000].num_blocks[lVar7];
      lVar10 = (long)(int)IVar6 % GA[g_a + 1000].num_blocks[lVar7 + 1];
      _index[lVar7 + 1] = (int)lVar10;
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    if ((short)uVar9 < 1) {
      uVar9 = 0;
    }
    iVar14 = 0;
    for (; (ulong)uVar9 * 4 != lVar7; lVar7 = lVar7 + 4) {
      pCVar4 = GA[lVar1].mapc;
      iVar3 = *(int *)((long)_index + lVar7);
      lVar15 = (long)iVar14 + (long)iVar3;
      *(C_Integer *)((long)_lo + lVar7 * 2) = pCVar4[lVar15];
      lVar10 = *(long *)((long)GA[lVar1].num_blocks + lVar7 * 2);
      if ((long)iVar3 < lVar10 + -1) {
        lVar15 = pCVar4[lVar15 + 1] + -1;
      }
      else {
        lVar15 = *(long *)((long)GA[lVar1].dims + lVar7 * 2);
      }
      *(long *)((long)_hi + lVar7 * 2) = lVar15;
      iVar14 = iVar14 + (int)lVar10;
    }
  }
  else if (iVar14 == 0) {
    if (GA[lVar1].num_rstrctd == 0) {
      lVar10 = 0;
      lVar7 = lVar12;
      if (lVar12 < 1) {
        lVar7 = lVar10;
      }
      lVar15 = 1;
      for (; lVar7 != lVar10; lVar10 = lVar10 + 1) {
        lVar15 = lVar15 * GA[g_a + 1000].nblock[lVar10];
      }
      if ((proc < 0) || (lVar15 <= proc)) {
        for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
          _lo[lVar10] = 0;
          _hi[lVar10] = -1;
        }
      }
      else {
        lVar15 = 0;
        IVar6 = proc;
        for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
          lVar16 = (long)GA[g_a + 1000].nblock[lVar10];
          lVar18 = IVar6 % lVar16;
          pCVar4 = GA[lVar1].mapc;
          _lo[lVar10] = pCVar4[lVar18 + lVar15];
          if (lVar18 == lVar16 + -1) {
            CVar11 = GA[g_a + 1000].dims[lVar10];
          }
          else {
            CVar11 = pCVar4[lVar18 + lVar15 + 1] + -1;
          }
          lVar15 = lVar15 + lVar16;
          _hi[lVar10] = CVar11;
          IVar6 = IVar6 / lVar16;
        }
      }
    }
    else if (proc < GA[lVar1].num_rstrctd) {
      lVar7 = 1;
      lVar15 = 0;
      lVar10 = lVar12;
      if (lVar12 < 1) {
        lVar10 = lVar15;
      }
      for (; lVar10 != lVar15; lVar15 = lVar15 + 1) {
        lVar7 = lVar7 * GA[g_a + 1000].nblock[lVar15];
      }
      if ((proc < 0) || (lVar7 <= proc)) {
        for (lVar7 = 0; lVar10 != lVar7; lVar7 = lVar7 + 1) {
          _lo[lVar7] = 0;
          _hi[lVar7] = -1;
        }
      }
      else {
        lVar7 = 0;
        IVar6 = proc;
        for (lVar15 = 0; lVar10 != lVar15; lVar15 = lVar15 + 1) {
          lVar16 = (long)GA[g_a + 1000].nblock[lVar15];
          lVar18 = IVar6 % lVar16;
          pCVar4 = GA[lVar1].mapc;
          _lo[lVar15] = pCVar4[lVar18 + lVar7];
          if (lVar18 == lVar16 + -1) {
            CVar11 = GA[g_a + 1000].dims[lVar15];
          }
          else {
            CVar11 = pCVar4[lVar18 + lVar7 + 1] + -1;
          }
          lVar7 = lVar7 + lVar16;
          _hi[lVar15] = CVar11;
          IVar6 = IVar6 / lVar16;
        }
      }
    }
    else {
      lVar7 = 0;
      iVar14 = 0;
      if (0 < (short)uVar9) {
        iVar14 = (int)(short)uVar9;
      }
      for (; iVar14 != lVar7; lVar7 = lVar7 + 1) {
        _lo[lVar7] = 0;
        _hi[lVar7] = -1;
      }
    }
  }
  if (lVar13 == 0) {
    *ld = (_hi[0] - _lo[0]) + GA[lVar1].width[0] * 2 + 1;
  }
  lVar7 = 0;
  if (lVar13 < 1) {
    lVar13 = lVar7;
  }
  lVar10 = 1;
  for (lVar15 = 0; lVar13 != lVar15; lVar15 = lVar15 + 1) {
    lVar7 = lVar7 + dims[lVar15] * lVar10;
    lVar18 = (_hi[lVar15] - _lo[lVar15]) + pgVar5[g_a + 1000].width[lVar15] * 2 + 1;
    ld[lVar15] = lVar18;
    lVar10 = lVar10 * lVar18;
  }
  *(char **)ptr =
       pgVar5[lVar1].ptr[proc] + (long)pgVar5[lVar1].elemsize * (lVar10 * dims[lVar12 + -1] + lVar7)
  ;
  pgVar5 = GA;
  for (uVar17 = 0; uVar2 != uVar17; uVar17 = uVar17 + 1) {
    dims[uVar17] = (hi[uVar17] - lo[uVar17]) + pgVar5[g_a + 1000].width[uVar17] * 2 + 1;
  }
  return;
}

Assistant:

void pnga_access_ghost_ptr(Integer g_a, Integer dims[],
                      void* ptr, Integer ld[])

{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i, lo[MAXDIM], hi[MAXDIM];
Integer ndim = GA[handle].ndim;
Integer me = pnga_nodeid();


   pnga_distribution(g_a, me, lo, hi);

   for (i=0; i < ndim; i++) {
     dims[i] = 0;
   }

   gam_LocationWithGhosts(me, handle, dims, &lptr, ld);
   *(char**)ptr = lptr; 
   for (i=0; i < ndim; i++)
     dims[i] = hi[i] - lo[i] + 1 + 2*(Integer)GA[handle].width[i];
}